

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O1

REF_STATUS
distance_metric_fill(REF_GRID_conflict ref_grid,REF_DICT ref_dict_bcs,int argc,char **argv)

{
  REF_MPI pRVar1;
  int iVar2;
  REF_DICT ref_dict;
  uint uVar3;
  uint uVar4;
  undefined4 uVar5;
  REF_STATUS RVar6;
  FILE *__stream;
  double *pdVar7;
  char *pcVar8;
  REF_DBL *pRVar9;
  REF_DICT distance;
  REF_DBL *pRVar10;
  REF_NODE pRVar11;
  undefined8 uVar12;
  int iVar13;
  long lVar14;
  REF_DBL *pRVar15;
  char *pcVar16;
  uint uVar17;
  size_t sVar18;
  long lVar19;
  bool bVar20;
  double dVar21;
  REF_DBL RVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  REF_INT n_tab;
  REF_DBL h;
  REF_INT pos;
  REF_DBL h_1;
  char line [1024];
  uint local_4fc;
  REF_DBL *local_4f8;
  REF_DBL *local_4f0;
  double local_4e8;
  REF_MPI local_4e0;
  REF_DBL *local_4d8;
  REF_GRID_conflict local_4d0;
  undefined8 local_4c8;
  int local_4bc;
  double local_4b8;
  double local_4b0;
  double local_4a8;
  double local_4a0;
  REF_DICT local_498;
  REF_DBL *local_490;
  double local_488;
  double local_480;
  REF_NODE local_478;
  uint local_46c;
  double local_468 [4];
  undefined8 local_448;
  double local_440;
  double local_438;
  double local_430;
  double dStack_428;
  REF_DBL local_420;
  REF_DBL local_418;
  REF_DBL local_410;
  REF_DBL local_408 [3];
  REF_DBL local_3f0 [120];
  
  pRVar1 = ref_grid->mpi;
  pRVar11 = ref_grid->node;
  local_4fc = 0;
  local_498 = ref_dict_bcs;
  uVar3 = ref_args_find(argc,argv,"--aspect-ratio",&local_4bc);
  if ((uVar3 != 0) && (uVar3 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0x1ac,"distance_metric_fill",(ulong)uVar3,"arg search");
    return uVar3;
  }
  local_4e0 = pRVar1;
  local_478 = pRVar11;
  if (local_4bc < argc + -1 && local_4bc != -1) {
    dVar21 = atof(argv[(long)local_4bc + 1]);
    local_4a0 = 1.0;
    if (1.0 <= dVar21) {
      local_4a0 = dVar21;
    }
    if (local_4e0->id == 0) {
      printf("limit --aspect-ratio to %f for --stepexp\n",local_4a0);
    }
  }
  else {
    local_4a0 = 1.0;
  }
  uVar4 = ref_args_find(argc,argv,"--stepexp",&local_4bc);
  if ((uVar4 != 0) && (uVar4 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0x1b5,"distance_metric_fill",(ulong)uVar4,"arg search");
    uVar3 = uVar4;
  }
  iVar2 = local_4bc;
  if ((uVar4 != 5) && (uVar4 != 0)) {
    return uVar3;
  }
  lVar19 = (long)local_4bc;
  local_4d0 = ref_grid;
  if (lVar19 == -1) {
    uVar5 = 0;
    dVar21 = 0.0;
    local_480 = 0.0;
    local_4b8 = 0.0;
    local_4b0 = 0.0;
    local_4a8 = 0.0;
    local_4e8 = 0.0;
  }
  else {
    if (argc <= local_4bc + 6) {
      pcVar16 = "not enough --stepexp args";
      uVar12 = 0x1b8;
      goto LAB_00120e52;
    }
    local_4e8 = atof(argv[lVar19 + 1]);
    local_4a8 = atof(argv[lVar19 + 2]);
    local_4b0 = atof(argv[lVar19 + 3]);
    local_4b8 = atof(argv[lVar19 + 4]);
    local_480 = atof(argv[lVar19 + 5]);
    dVar21 = atof(argv[lVar19 + 6]);
    if (local_4e0->id == 0) {
      local_488 = dVar21;
      printf("h0 %f h1 %f h2 %f s1 %f s2 %f width %f\n",local_4e8,local_4a8,local_4b0,local_4b8,
             local_480,dVar21);
      dVar21 = local_488;
    }
    if (local_4e8 <= 0.0) {
      pcVar16 = "positive h0";
      uVar12 = 0x1c2;
      goto LAB_00120e52;
    }
    if (local_4a8 <= 0.0) {
      pcVar16 = "positive h1";
      uVar12 = 0x1c3;
      goto LAB_00120e52;
    }
    if (local_4b0 <= 0.0) {
      pcVar16 = "positive h2";
      uVar12 = 0x1c4;
      goto LAB_00120e52;
    }
    if (local_4b8 <= 0.0) {
      pcVar16 = "positive s1";
      uVar12 = 0x1c5;
      goto LAB_00120e52;
    }
    if (local_480 <= 0.0) {
      pcVar16 = "positive s2";
      uVar12 = 0x1c6;
      goto LAB_00120e52;
    }
    uVar5 = 1;
    if (dVar21 <= 0.0) {
      pcVar16 = "positive width";
      uVar12 = 0x1c7;
      goto LAB_00120e52;
    }
  }
  local_490 = (REF_DBL *)CONCAT44(local_490._4_4_,uVar5);
  local_488 = dVar21;
  uVar4 = ref_args_find(argc,argv,"--spacing-table",&local_4bc);
  if ((uVar4 != 0) && (uVar4 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0x1cb,"distance_metric_fill",(ulong)uVar4,"metric arg search");
    uVar3 = uVar4;
  }
  if ((uVar4 != 5) && (uVar4 != 0)) {
    return uVar3;
  }
  if (local_4bc < argc + -1 && local_4bc != -1) {
    if (local_4e0->id == 0) {
      pcVar16 = argv[(long)local_4bc + 1];
      __stream = fopen(pcVar16,"r");
      if (__stream == (FILE *)0x0) {
        printf("unable to open %s\n",pcVar16);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x1d6,"distance_metric_fill","unable to open file");
        uVar4 = 2;
        goto LAB_0012078a;
      }
      local_4fc = 0;
      pdVar7 = (double *)fgets((char *)&local_438,0x400,__stream);
      if (&local_438 == pdVar7) {
        do {
          pcVar8 = strtok((char *)&local_438," ");
          if (pcVar8 != (char *)0x0) {
            iVar13 = 1;
            do {
              pcVar8 = strtok((char *)0x0," ");
              iVar13 = iVar13 + -1;
            } while (pcVar8 != (char *)0x0);
            if (iVar13 != 0) {
              local_4fc = local_4fc + 1;
            }
          }
          pdVar7 = (double *)fgets((char *)&local_438,0x400,__stream);
        } while (&local_438 == pdVar7);
      }
      printf(" %d breakpoints in %s\n",(ulong)local_4fc,pcVar16);
      uVar4 = local_4fc;
      if ((long)(int)local_4fc < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x1e2,"distance_metric_fill","malloc tab_dist of REF_DBL negative");
        uVar3 = 1;
LAB_00120d13:
        bVar20 = false;
        pRVar9 = (REF_DBL *)0x0;
      }
      else {
        sVar18 = (long)(int)local_4fc * 8;
        pRVar9 = (REF_DBL *)malloc(sVar18);
        if (pRVar9 == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x1e2,"distance_metric_fill","malloc tab_dist of REF_DBL NULL");
          uVar3 = 2;
          goto LAB_00120d13;
        }
        bVar20 = true;
        if (uVar4 != 0) {
          memset(pRVar9,0,sVar18);
        }
      }
      uVar4 = local_4fc;
      local_4d8 = pRVar9;
      if (bVar20) {
        if ((long)(int)local_4fc < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x1e3,"distance_metric_fill","malloc tab_h of REF_DBL negative");
          uVar3 = 1;
LAB_00120eac:
          bVar20 = false;
          pRVar9 = (REF_DBL *)0x0;
        }
        else {
          sVar18 = (long)(int)local_4fc * 8;
          pRVar9 = (REF_DBL *)malloc(sVar18);
          if (pRVar9 == (REF_DBL *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x1e3,"distance_metric_fill","malloc tab_h of REF_DBL NULL");
            uVar3 = 2;
            goto LAB_00120eac;
          }
          bVar20 = true;
          if (uVar4 != 0) {
            memset(pRVar9,0,sVar18);
          }
        }
        uVar4 = local_4fc;
        if (bVar20) {
          lVar19 = (long)(int)local_4fc;
          if (lVar19 < 0) {
            uVar3 = 1;
            pcVar16 = "malloc tab_ar of REF_DBL negative";
LAB_00121014:
            bVar20 = false;
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x1e4,"distance_metric_fill",pcVar16);
            pRVar10 = (REF_DBL *)0x0;
          }
          else {
            pRVar10 = (REF_DBL *)malloc(lVar19 * 8);
            if (pRVar10 == (REF_DBL *)0x0) {
              uVar3 = 2;
              pcVar16 = "malloc tab_ar of REF_DBL NULL";
              goto LAB_00121014;
            }
            bVar20 = true;
            if (uVar4 != 0) {
              lVar14 = 0;
              do {
                pRVar10[lVar14] = 1.0;
                lVar14 = lVar14 + 1;
              } while (lVar19 != lVar14);
            }
          }
          if (bVar20) {
            local_4f8 = pRVar10;
            iVar13 = fseek(__stream,0,0);
            if (iVar13 == 0) {
              local_46c = local_4fc;
              local_4fc = 0;
              local_4f0 = pRVar9;
              pdVar7 = (double *)fgets((char *)&local_438,0x400,__stream);
              pRVar10 = local_4d8;
              if ((&local_438 == pdVar7) && ((int)local_4fc < (int)local_46c)) {
                do {
                  pcVar16 = strtok((char *)&local_438," ");
                  if (pcVar16 != (char *)0x0) {
                    iVar13 = 0;
                    do {
                      if (iVar13 == 2) {
                        dVar21 = atof(pcVar16);
                        pRVar9 = local_4f8;
LAB_0012114a:
                        pRVar9[(int)local_4fc] = dVar21;
                      }
                      else {
                        if (iVar13 == 1) {
                          dVar21 = atof(pcVar16);
                          pRVar9 = local_4f0;
                          goto LAB_0012114a;
                        }
                        if (iVar13 == 0) {
                          dVar21 = atof(pcVar16);
                          pRVar9 = pRVar10;
                          goto LAB_0012114a;
                        }
                      }
                      iVar13 = iVar13 + 1;
                      pcVar16 = strtok((char *)0x0," ");
                    } while (pcVar16 != (char *)0x0);
                    if (iVar13 != 1) {
                      lVar19 = (long)(int)local_4fc;
                      printf(" %f %f %f %d\n",pRVar10[lVar19],local_4f0[lVar19],local_4f8[lVar19]);
                      local_4fc = local_4fc + 1;
                    }
                  }
                  pdVar7 = (double *)fgets((char *)&local_438,0x400,__stream);
                } while ((&local_438 == pdVar7) && ((int)local_4fc < (int)local_46c));
              }
              fclose(__stream);
              uVar4 = ref_mpi_bcast(local_4e0,&local_4fc,1,1);
              pRVar9 = local_4f0;
              if (uVar4 == 0) {
                if ((int)local_4fc < 3) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                         ,0x1fa,"distance_metric_fill","table requires 2 entries");
                  uVar3 = 1;
                }
                else {
                  uVar4 = ref_mpi_bcast(local_4e0,pRVar10,local_4fc,3);
                  if (uVar4 == 0) {
                    uVar4 = ref_mpi_bcast(local_4e0,local_4f0,local_4fc,3);
                    if (uVar4 == 0) {
                      uVar4 = ref_mpi_bcast(local_4e0,local_4f8,local_4fc,3);
                      pRVar9 = local_4f0;
                      if (uVar4 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                               ,0x1fe,"distance_metric_fill",(ulong)uVar4,"n_tab");
                        pRVar9 = local_4f0;
                        uVar3 = uVar4;
                      }
                      goto LAB_0012143c;
                    }
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                           ,0x1fd,"distance_metric_fill",(ulong)uVar4,"n_tab");
                    pRVar9 = local_4f0;
                    uVar3 = uVar4;
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                           ,0x1fc,"distance_metric_fill",(ulong)uVar4,"n_tab");
                    pRVar9 = local_4f0;
                    uVar3 = uVar4;
                  }
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                       ,0x1f9,"distance_metric_fill",(ulong)uVar4,"n_tab");
                pRVar9 = local_4f0;
                uVar3 = uVar4;
              }
            }
            else {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x1e5,"distance_metric_fill","rewind");
              uVar3 = 1;
            }
LAB_00121af9:
            iVar13 = 0;
            bVar20 = false;
            pRVar10 = local_4f8;
            goto LAB_0012079b;
          }
        }
        else {
LAB_00120ffe:
          pRVar10 = (REF_DBL *)0x0;
        }
      }
      else {
LAB_00120df3:
        pRVar10 = (REF_DBL *)0x0;
        pRVar9 = (REF_DBL *)0x0;
      }
LAB_00120798:
      bVar20 = false;
      iVar13 = 0;
    }
    else {
      uVar4 = ref_mpi_bcast(local_4e0,&local_4fc,1,1);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x200,"distance_metric_fill",(ulong)uVar4,"n_tab");
LAB_0012078a:
        pRVar9 = (REF_DBL *)0x0;
        local_4d8 = (REF_DBL *)0x0;
        pRVar10 = (REF_DBL *)0x0;
        uVar3 = uVar4;
        goto LAB_00120798;
      }
      if ((long)(int)local_4fc < 3) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x201,"distance_metric_fill","table requires 2 entries");
        uVar4 = 1;
        goto LAB_0012078a;
      }
      sVar18 = (long)(int)local_4fc << 3;
      pRVar9 = (REF_DBL *)malloc(sVar18);
      if (pRVar9 == (REF_DBL *)0x0) {
        local_4d8 = (REF_DBL *)0x0;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x202,"distance_metric_fill","malloc tab_dist of REF_DBL NULL");
        uVar3 = 2;
        goto LAB_00120df3;
      }
      memset(pRVar9,0,sVar18);
      uVar4 = local_4fc;
      local_4d8 = pRVar9;
      if ((long)(int)local_4fc < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x203,"distance_metric_fill","malloc tab_h of REF_DBL negative");
        uVar3 = 1;
LAB_00120fa8:
        bVar20 = false;
        pRVar9 = (REF_DBL *)0x0;
      }
      else {
        sVar18 = (long)(int)local_4fc * 8;
        pRVar9 = (REF_DBL *)malloc(sVar18);
        if (pRVar9 == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x203,"distance_metric_fill","malloc tab_h of REF_DBL NULL");
          uVar3 = 2;
          goto LAB_00120fa8;
        }
        bVar20 = true;
        if (uVar4 != 0) {
          memset(pRVar9,0,sVar18);
        }
      }
      uVar4 = local_4fc;
      if (!bVar20) goto LAB_00120ffe;
      lVar19 = (long)(int)local_4fc;
      if (lVar19 < 0) {
        uVar17 = 1;
        pcVar16 = "malloc tab_ar of REF_DBL negative";
LAB_00121301:
        bVar20 = false;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x204,"distance_metric_fill",pcVar16);
        pRVar10 = (REF_DBL *)0x0;
      }
      else {
        pRVar10 = (REF_DBL *)malloc(lVar19 * 8);
        if (pRVar10 == (REF_DBL *)0x0) {
          uVar17 = 2;
          pcVar16 = "malloc tab_ar of REF_DBL NULL";
          goto LAB_00121301;
        }
        bVar20 = true;
        uVar17 = uVar3;
        if (uVar4 != 0) {
          lVar14 = 0;
          do {
            pRVar10[lVar14] = 1.0;
            lVar14 = lVar14 + 1;
          } while (lVar19 != lVar14);
        }
      }
      uVar3 = uVar17;
      if (!bVar20) goto LAB_00120798;
      local_4f8 = pRVar10;
      uVar3 = ref_mpi_bcast(local_4e0,local_4d8,local_4fc,3);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x206,"distance_metric_fill",(ulong)uVar3,"n_tab");
        pRVar10 = local_4f8;
        goto LAB_00120798;
      }
      uVar3 = ref_mpi_bcast(local_4e0,pRVar9,local_4fc,3);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x207,"distance_metric_fill",(ulong)uVar3,"n_tab");
        goto LAB_00121af9;
      }
      uVar4 = ref_mpi_bcast(local_4e0,local_4f8,local_4fc,3);
      uVar3 = uVar17;
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x208,"distance_metric_fill",(ulong)uVar4,"n_tab");
        uVar3 = uVar4;
      }
LAB_0012143c:
      bVar20 = false;
      iVar13 = 0;
      pRVar10 = local_4f8;
      if (uVar4 == 0) {
        iVar13 = 1;
        bVar20 = true;
      }
    }
LAB_0012079b:
    if (!bVar20) {
      return uVar3;
    }
  }
  else {
    pRVar10 = (REF_DBL *)0x0;
    pRVar9 = (REF_DBL *)0x0;
    local_4d8 = (REF_DBL *)0x0;
    iVar13 = 0;
  }
  pRVar1 = local_4e0;
  if ((int)local_490 == iVar13) {
    pcVar16 = "set one and only one of --stepexp and --spacing-table";
    uVar12 = 0x20e;
  }
  else {
    if (-1 < (long)local_478->max) {
      local_4f8 = pRVar10;
      distance = (REF_DICT)malloc((long)local_478->max << 3);
      ref_dict = local_498;
      if (distance == (REF_DICT)0x0) {
        pcVar16 = "malloc distance of REF_DBL NULL";
        uVar12 = 0x210;
      }
      else {
        local_498 = distance;
        uVar4 = ref_phys_wall_distance(local_4d0,ref_dict,(REF_DBL *)distance);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x211,"distance_metric_fill",(ulong)uVar4,"wall dist");
          return uVar4;
        }
        ref_mpi_stopwatch_stop(pRVar1,"wall distance");
        uVar4 = local_4d0->node->max;
        if ((int)uVar4 < 0) {
          pcVar16 = "malloc grad_dist of REF_DBL negative";
          uVar12 = 0x214;
          goto LAB_00120e52;
        }
        pRVar10 = (REF_DBL *)malloc((ulong)uVar4 * 0x18);
        if (pRVar10 != (REF_DBL *)0x0) {
          local_490 = pRVar10;
          uVar4 = ref_recon_gradient(local_4d0,(REF_DBL *)local_498,pRVar10,REF_RECON_L2PROJECTION);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x215,"distance_metric_fill",(ulong)uVar4,"grad dist");
            return uVar4;
          }
          pRVar10 = local_4f8;
          local_4f0 = pRVar9;
          if (iVar2 != -1) {
            pRVar11 = local_4d0->node;
            if (local_4a0 <= 0.0) {
              if (0 < pRVar11->max) {
                lVar19 = 0;
                RVar22 = local_4e8;
                do {
                  if (-1 < pRVar11->global[lVar19]) {
                    uVar4 = ref_metric_step_exp(*(REF_DBL *)(&local_498->n + lVar19 * 2),local_468,
                                                RVar22,local_4a8,local_4b0,local_4b8,local_480,
                                                local_488);
                    if (uVar4 == 0) {
                      local_438 = 1.0 / (local_468[0] * local_468[0]);
                      local_430 = 0.0;
                      dStack_428 = 0.0;
                      local_418 = 0.0;
                      local_420 = local_438;
                      local_410 = local_438;
                      if ((local_4d0->twod != 0) &&
                         (uVar4 = ref_matrix_twod_m(&local_438), uVar4 != 0)) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                               ,0x240,"distance_metric_fill",(ulong)uVar4,"enforce 2d");
                        goto LAB_001214f5;
                      }
                      uVar4 = ref_node_metric_set(local_478,(REF_INT)lVar19,&local_438);
                      bVar20 = uVar4 == 0;
                      if (!bVar20) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                               ,0x241,"distance_metric_fill",(ulong)uVar4,"set");
                        uVar3 = uVar4;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                             ,0x239,"distance_metric_fill",(ulong)uVar4,"step exp");
LAB_001214f5:
                      bVar20 = false;
                      uVar3 = uVar4;
                    }
                    pRVar10 = local_4f8;
                    pRVar9 = local_4f0;
                    RVar22 = local_4e8;
                    if (!bVar20) {
                      return uVar3;
                    }
                  }
                  lVar19 = lVar19 + 1;
                  pRVar11 = local_4d0->node;
                } while (lVar19 < pRVar11->max);
              }
            }
            else if (0 < pRVar11->max) {
              pRVar15 = local_490 + 2;
              lVar19 = 0;
              RVar22 = local_4e8;
              do {
                if (-1 < pRVar11->global[lVar19]) {
                  uVar4 = ref_metric_step_exp(*(REF_DBL *)(&local_498->n + lVar19 * 2),
                                              (REF_DBL *)&local_4c8,RVar22,local_4a8,local_4b0,
                                              local_4b8,local_480,local_488);
                  if (uVar4 == 0) {
                    dVar21 = (double)CONCAT44(local_4c8._4_4_,(uint)local_4c8);
                    local_438 = 1.0 / (dVar21 * dVar21);
                    local_430 = 1.0 / (local_4a0 * dVar21 * local_4a0 * dVar21);
                    local_420 = pRVar15[-2];
                    local_418 = pRVar15[-1];
                    local_410 = *pRVar15;
                    dStack_428 = local_430;
                    RVar6 = ref_math_normalize(&local_420);
                    if (RVar6 == 0) {
                      uVar4 = ref_math_orthonormal_system(&local_420,local_408,local_3f0);
                      if (uVar4 == 0) {
                        uVar4 = ref_matrix_form_m(&local_438,local_468);
                        if (uVar4 == 0) goto LAB_00120acd;
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                               ,0x228,"distance_metric_fill",(ulong)uVar4,"form m from d");
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                               ,0x227,"distance_metric_fill",(ulong)uVar4,"ortho sys");
                      }
                      goto LAB_001209b2;
                    }
                    local_468[0] = 1.0 / ((double)CONCAT44(local_4c8._4_4_,(uint)local_4c8) *
                                         (double)CONCAT44(local_4c8._4_4_,(uint)local_4c8));
                    local_468[1] = 0.0;
                    local_468[2] = 0.0;
                    local_448 = 0;
                    local_468[3] = local_468[0];
                    local_440 = local_468[0];
LAB_00120acd:
                    if ((local_4d0->twod != 0) && (uVar4 = ref_matrix_twod_m(local_468), uVar4 != 0)
                       ) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                             ,0x231,"distance_metric_fill",(ulong)uVar4,"enforce 2d");
                      goto LAB_001209b2;
                    }
                    uVar4 = ref_node_metric_set(local_478,(REF_INT)lVar19,local_468);
                    bVar20 = uVar4 == 0;
                    if (!bVar20) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                             ,0x232,"distance_metric_fill",(ulong)uVar4,"set");
                      uVar3 = uVar4;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                           ,0x21e,"distance_metric_fill",(ulong)uVar4,"step exp");
LAB_001209b2:
                    bVar20 = false;
                    uVar3 = uVar4;
                  }
                  pRVar10 = local_4f8;
                  pRVar9 = local_4f0;
                  RVar22 = local_4e8;
                  if (!bVar20) {
                    return uVar3;
                  }
                }
                lVar19 = lVar19 + 1;
                pRVar11 = local_4d0->node;
                pRVar15 = pRVar15 + 3;
              } while (lVar19 < pRVar11->max);
            }
          }
          if (iVar13 != 0) {
            pRVar11 = local_4d0->node;
            if (0 < pRVar11->max) {
              pRVar15 = local_490 + 2;
              lVar19 = 0;
              do {
                if (-1 < pRVar11->global[lVar19]) {
                  local_4e0 = *(REF_MPI *)(&local_498->n + lVar19 * 2);
                  uVar4 = ref_sort_search_dbl(local_4fc,local_4d8,(REF_DBL)local_4e0,
                                              (REF_INT *)&local_4c8);
                  if (uVar4 == 0) {
                    lVar14 = (long)(int)(uint)local_4c8;
                    dVar23 = local_4d8[lVar14 + 1] - local_4d8[lVar14];
                    dVar24 = (double)local_4e0 - local_4d8[lVar14];
                    dVar21 = dVar23 * 1e+20;
                    if (dVar21 <= -dVar21) {
                      dVar21 = -dVar21;
                    }
                    dVar25 = dVar24;
                    if (dVar24 <= -dVar24) {
                      dVar25 = -dVar24;
                    }
                    dVar21 = (double)(-(ulong)(dVar25 < dVar21) & (ulong)(dVar24 / dVar23));
                    local_4e8 = 0.0;
                    if (0.0 <= dVar21) {
                      local_4e8 = dVar21;
                    }
                    if (1.0 <= local_4e8) {
                      local_4e8 = 1.0;
                    }
                    local_4a8 = 1.0 - local_4e8;
                    local_4b0 = local_4f0[lVar14] * local_4a8 + local_4f0[lVar14 + 1] * local_4e8;
                    local_4b8 = local_4f8[lVar14] * local_4a8 + local_4f8[lVar14 + 1] * local_4e8;
                    local_4a0 = 1.0 / (local_4b0 * local_4b0);
                    local_430 = 1.0 / (local_4b8 * local_4b0 * local_4b8 * local_4b0);
                    local_420 = pRVar15[-2];
                    local_418 = pRVar15[-1];
                    local_410 = *pRVar15;
                    local_438 = local_4a0;
                    dStack_428 = local_430;
                    RVar6 = ref_math_normalize(&local_420);
                    if (RVar6 == 0) {
                      uVar4 = ref_math_orthonormal_system(&local_420,local_408,local_3f0);
                      pRVar11 = local_478;
                      if (uVar4 == 0) {
                        uVar4 = ref_matrix_form_m(&local_438,local_468);
                        if (uVar4 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                                 ,0x263,"distance_metric_fill",(ulong)uVar4,"form m from d");
                          bVar20 = false;
                          pRVar9 = local_4f0;
                          uVar3 = uVar4;
                          goto LAB_001219f3;
                        }
                        goto LAB_0012186d;
                      }
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                             ,0x262,"distance_metric_fill",(ulong)uVar4,"ortho sys");
                      uVar3 = uVar4;
                    }
                    else {
                      local_468[0] = local_4a0;
                      local_468[1] = 0.0;
                      local_468[2] = 0.0;
                      local_468[3] = local_4a0;
                      local_448 = 0;
                      local_440 = local_4a0;
                      pRVar11 = local_478;
LAB_0012186d:
                      if ((local_4d0->twod == 0) ||
                         (uVar4 = ref_matrix_twod_m(local_468), uVar4 == 0)) {
                        uVar4 = ref_node_metric_set(pRVar11,(REF_INT)lVar19,local_468);
                        bVar20 = uVar4 == 0;
                        pRVar9 = local_4f0;
                        if (!bVar20) {
                          local_4a0 = (double)CONCAT44(local_4a0._4_4_,uVar4);
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                                 ,0x272,"distance_metric_fill",(ulong)uVar4,"set");
                          printf("dist %f h %f ar %f t0 %f t1 %f i0 %d i1 %d\n",local_4e0,local_4b0,
                                 local_4b8,local_4a8,local_4e8,(ulong)(uint)local_4c8,
                                 lVar14 + 1U & 0xffffffff);
                          pRVar9 = local_4f0;
                          printf("tab_h[i0] %f tab_h[i1] %f tab_h[i0] %f tab_h[i1] %f\n",
                                 local_4d8[(int)(uint)local_4c8],local_4d8[lVar14 + 1],
                                 local_4f0[(int)(uint)local_4c8],local_4f0[lVar14 + 1]);
                          uVar3 = local_4a0._0_4_;
                        }
                        goto LAB_001219f3;
                      }
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                             ,0x26c,"distance_metric_fill",(ulong)uVar4,"enforce 2d");
                      uVar3 = uVar4;
                    }
                    bVar20 = false;
                    pRVar9 = local_4f0;
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                           ,0x24f,"distance_metric_fill",(ulong)uVar4,"first index on range");
                    bVar20 = false;
                    pRVar9 = local_4f0;
                    uVar3 = uVar4;
                  }
LAB_001219f3:
                  pRVar10 = local_4f8;
                  if (!bVar20) {
                    return uVar3;
                  }
                }
                lVar19 = lVar19 + 1;
                pRVar11 = local_4d0->node;
                pRVar15 = pRVar15 + 3;
              } while (lVar19 < pRVar11->max);
            }
            if (pRVar10 != (REF_DBL *)0x0) {
              free(pRVar10);
            }
            pRVar10 = local_4d8;
            if (pRVar9 != (REF_DBL *)0x0) {
              free(pRVar9);
            }
            if (pRVar10 != (REF_DBL *)0x0) {
              free(local_4d8);
            }
          }
          free(local_490);
          free(local_498);
          return 0;
        }
        pcVar16 = "malloc grad_dist of REF_DBL NULL";
        uVar12 = 0x214;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             uVar12,"distance_metric_fill",pcVar16);
      return 2;
    }
    pcVar16 = "malloc distance of REF_DBL negative";
    uVar12 = 0x210;
  }
LAB_00120e52:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
         uVar12,"distance_metric_fill",pcVar16);
  return 1;
}

Assistant:

static REF_STATUS distance_metric_fill(REF_GRID ref_grid, REF_DICT ref_dict_bcs,
                                       int argc, char *argv[]) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *distance;
  REF_INT node;
  REF_INT pos;
  REF_DBL h0 = 0.0, h1 = 0.0, h2 = 0.0, s1 = 0.0, s2 = 0.0, width = 0.0;
  REF_DBL aspect_ratio = 1.0;
  REF_BOOL have_stepexp = REF_FALSE;
  REF_BOOL have_spacing_table = REF_FALSE;
  REF_DBL *grad_dist;
  REF_RECON_RECONSTRUCTION recon = REF_RECON_L2PROJECTION;
  REF_INT n_tab = 0, max_tab;
  REF_DBL *tab_dist = NULL, *tab_h = NULL, *tab_ar = NULL;

  RXS(ref_args_find(argc, argv, "--aspect-ratio", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos && pos < argc - 1) {
    aspect_ratio = atof(argv[pos + 1]);
    aspect_ratio = MAX(1.0, aspect_ratio);
    if (ref_mpi_once(ref_mpi))
      printf("limit --aspect-ratio to %f for --stepexp\n", aspect_ratio);
  }

  RXS(ref_args_find(argc, argv, "--stepexp", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    have_stepexp = REF_TRUE;
    RAS(pos + 6 < argc, "not enough --stepexp args");
    h0 = atof(argv[pos + 1]);
    h1 = atof(argv[pos + 2]);
    h2 = atof(argv[pos + 3]);
    s1 = atof(argv[pos + 4]);
    s2 = atof(argv[pos + 5]);
    width = atof(argv[pos + 6]);
    if (ref_mpi_once(ref_mpi))
      printf("h0 %f h1 %f h2 %f s1 %f s2 %f width %f\n", h0, h1, h2, s1, s2,
             width);
    RAS(h0 > 0.0, "positive h0");
    RAS(h1 > 0.0, "positive h1");
    RAS(h2 > 0.0, "positive h2");
    RAS(s1 > 0.0, "positive s1");
    RAS(s2 > 0.0, "positive s2");
    RAS(width > 0.0, "positive width");
  }

  RXS(ref_args_find(argc, argv, "--spacing-table", &pos), REF_NOT_FOUND,
      "metric arg search");
  if (REF_EMPTY != pos && pos < argc - 1) {
    FILE *file = NULL;
    char line[1024];
    const char *filename = argv[pos + 1];
    const char *token;
    const char space[] = " ";
    REF_INT ncol;
    if (ref_mpi_once(ref_mpi)) {
      file = fopen(filename, "r");
      if (NULL == (void *)file) printf("unable to open %s\n", filename);
      RNS(file, "unable to open file");
      n_tab = 0;
      while (line == fgets(line, 1024, file)) {
        ncol = 0;
        token = strtok(line, space);
        while (token != NULL) {
          ncol++;
          token = strtok(NULL, space);
        }
        if (ncol >= 2) n_tab++;
      }
      printf(" %d breakpoints in %s\n", n_tab, filename);
      ref_malloc_init(tab_dist, n_tab, REF_DBL, 0.0);
      ref_malloc_init(tab_h, n_tab, REF_DBL, 0.0);
      ref_malloc_init(tab_ar, n_tab, REF_DBL, 1.0);
      RAS(0 == fseek(file, 0, SEEK_SET), "rewind");
      max_tab = n_tab;
      n_tab = 0;
      while (line == fgets(line, 1024, file) && n_tab < max_tab) {
        ncol = 0;
        token = strtok(line, space);
        while (token != NULL) {
          if (0 == ncol) tab_dist[n_tab] = atof(token);
          if (1 == ncol) tab_h[n_tab] = atof(token);
          if (2 == ncol) tab_ar[n_tab] = atof(token);
          ncol++;
          token = strtok(NULL, space);
        }
        if (ncol >= 2) {
          printf(" %f %f %f %d\n", tab_dist[n_tab], tab_h[n_tab], tab_ar[n_tab],
                 n_tab);
          n_tab++;
        }
      }
      fclose(file);
      RSS(ref_mpi_bcast(ref_mpi, (void *)&n_tab, 1, REF_INT_TYPE), "n_tab");
      RAS(n_tab > 2, "table requires 2 entries");
      RSS(ref_mpi_bcast(ref_mpi, (void *)tab_dist, n_tab, REF_DBL_TYPE),
          "n_tab");
      RSS(ref_mpi_bcast(ref_mpi, (void *)tab_h, n_tab, REF_DBL_TYPE), "n_tab");
      RSS(ref_mpi_bcast(ref_mpi, (void *)tab_ar, n_tab, REF_DBL_TYPE), "n_tab");
    } else {
      RSS(ref_mpi_bcast(ref_mpi, (void *)&n_tab, 1, REF_INT_TYPE), "n_tab");
      RAS(n_tab > 2, "table requires 2 entries");
      ref_malloc_init(tab_dist, n_tab, REF_DBL, 0.0);
      ref_malloc_init(tab_h, n_tab, REF_DBL, 0.0);
      ref_malloc_init(tab_ar, n_tab, REF_DBL, 1.0);
      RSS(ref_mpi_bcast(ref_mpi, (void *)tab_dist, n_tab, REF_DBL_TYPE),
          "n_tab");
      RSS(ref_mpi_bcast(ref_mpi, (void *)tab_h, n_tab, REF_DBL_TYPE), "n_tab");
      RSS(ref_mpi_bcast(ref_mpi, (void *)tab_ar, n_tab, REF_DBL_TYPE), "n_tab");
    }
    have_spacing_table = REF_TRUE;
  }

  RAS(have_stepexp != have_spacing_table,
      "set one and only one of --stepexp and --spacing-table");

  ref_malloc(distance, ref_node_max(ref_node), REF_DBL);
  RSS(ref_phys_wall_distance(ref_grid, ref_dict_bcs, distance), "wall dist");
  ref_mpi_stopwatch_stop(ref_mpi, "wall distance");

  ref_malloc(grad_dist, 3 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  RSS(ref_recon_gradient(ref_grid, distance, grad_dist, recon), "grad dist");

  if (have_stepexp) {
    if (aspect_ratio > 0.0) {
      each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
        REF_DBL m[6];
        REF_DBL d[12];
        REF_DBL h;
        REF_DBL s = distance[node];
        RSS(ref_metric_step_exp(s, &h, h0, h1, h2, s1, s2, width), "step exp");
        ref_matrix_eig(d, 0) = 1.0 / (h * h);
        ref_matrix_eig(d, 1) = 1.0 / (aspect_ratio * h * aspect_ratio * h);
        ref_matrix_eig(d, 2) = 1.0 / (aspect_ratio * h * aspect_ratio * h);
        ref_matrix_vec(d, 0, 0) = grad_dist[0 + 3 * node];
        ref_matrix_vec(d, 1, 0) = grad_dist[1 + 3 * node];
        ref_matrix_vec(d, 2, 0) = grad_dist[2 + 3 * node];
        if (REF_SUCCESS == ref_math_normalize(&(d[3]))) {
          RSS(ref_math_orthonormal_system(&(d[3]), &(d[6]), &(d[9])),
              "ortho sys");
          RSS(ref_matrix_form_m(d, m), "form m from d");
        } else {
          m[0] = 1.0 / (h * h);
          m[1] = 0.0;
          m[2] = 0.0;
          m[3] = 1.0 / (h * h);
          m[4] = 0.0;
          m[5] = 1.0 / (h * h);
        }
        if (ref_grid_twod(ref_grid)) RSS(ref_matrix_twod_m(m), "enforce 2d");
        RSS(ref_node_metric_set(ref_node, node, m), "set");
      }
    } else {
      each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
        REF_DBL m[6];
        REF_DBL h;
        REF_DBL s = distance[node];
        RSS(ref_metric_step_exp(s, &h, h0, h1, h2, s1, s2, width), "step exp");
        m[0] = 1.0 / (h * h);
        m[1] = 0.0;
        m[2] = 0.0;
        m[3] = 1.0 / (h * h);
        m[4] = 0.0;
        m[5] = 1.0 / (h * h);
        if (ref_grid_twod(ref_grid)) RSS(ref_matrix_twod_m(m), "enforce 2d");
        RSS(ref_node_metric_set(ref_node, node, m), "set");
      }
    }
  }

  if (have_spacing_table) {
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      REF_DBL m[6];
      REF_DBL d[12];
      REF_DBL h;
      REF_DBL dist = distance[node];
      REF_INT i0, i1;
      REF_DBL t0, t1;
      RSS(ref_sort_search_dbl(n_tab, tab_dist, dist, &i0),
          "first index on range");
      i1 = i0 + 1;
      t1 = 0.0;
      if (ref_math_divisible((dist - tab_dist[i0]),
                             (tab_dist[i1] - tab_dist[i0]))) {
        t1 = (dist - tab_dist[i0]) / (tab_dist[i1] - tab_dist[i0]);
      }
      t1 = MIN(MAX(0.0, t1), 1.0);
      t0 = 1.0 - t1;
      h = t0 * tab_h[i0] + t1 * tab_h[i1];
      aspect_ratio = t0 * tab_ar[i0] + t1 * tab_ar[i1];
      ref_matrix_eig(d, 0) = 1.0 / (h * h);
      ref_matrix_eig(d, 1) = 1.0 / (aspect_ratio * h * aspect_ratio * h);
      ref_matrix_eig(d, 2) = 1.0 / (aspect_ratio * h * aspect_ratio * h);
      ref_matrix_vec(d, 0, 0) = grad_dist[0 + 3 * node];
      ref_matrix_vec(d, 1, 0) = grad_dist[1 + 3 * node];
      ref_matrix_vec(d, 2, 0) = grad_dist[2 + 3 * node];
      if (REF_SUCCESS == ref_math_normalize(&(d[3]))) {
        RSS(ref_math_orthonormal_system(&(d[3]), &(d[6]), &(d[9])),
            "ortho sys");
        RSS(ref_matrix_form_m(d, m), "form m from d");
      } else {
        m[0] = 1.0 / (h * h);
        m[1] = 0.0;
        m[2] = 0.0;
        m[3] = 1.0 / (h * h);
        m[4] = 0.0;
        m[5] = 1.0 / (h * h);
      }
      if (ref_grid_twod(ref_grid)) RSS(ref_matrix_twod_m(m), "enforce 2d");
      RSB(ref_node_metric_set(ref_node, node, m), "set", {
        printf("dist %f h %f ar %f t0 %f t1 %f i0 %d i1 %d\n", dist, h,
               aspect_ratio, t0, t1, i0, i1);
        printf("tab_h[i0] %f tab_h[i1] %f tab_h[i0] %f tab_h[i1] %f\n",
               tab_dist[i0], tab_dist[i1], tab_h[i0], tab_h[i1]);
      });
    }

    ref_free(tab_ar);
    ref_free(tab_h);
    ref_free(tab_dist);
  }

  ref_free(grad_dist);
  ref_free(distance);
  return REF_SUCCESS;
}